

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_wordwrap(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  char *zString;
  int iVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  int iBreaklen;
  int iLen;
  int local_44;
  char *local_40;
  int local_34;
  
  if ((nArg < 1) || (zString = jx9_value_to_string(*apArg,&local_34), local_34 < 1)) {
    jx9_value_string(pCtx->pRet,"",0);
  }
  else {
    local_44 = 0;
    iVar3 = 0x4b;
    local_40 = "";
    if (nArg != 1) {
      pObj = apArg[1];
      jx9MemObjToInteger(pObj);
      iVar1 = *(int *)&pObj->x;
      iVar3 = 0x4b;
      if (0 < iVar1) {
        iVar3 = iVar1;
      }
      if (2 < nArg) {
        local_40 = jx9_value_to_string(apArg[2],&local_44);
      }
    }
    if (local_44 < 1) {
      local_44 = 1;
      local_40 = "\n";
    }
    pcVar2 = zString + local_34;
    do {
      pcVar4 = zString;
      if (zString < pcVar2) {
        iVar1 = (int)pcVar2 - (int)zString;
        if (iVar3 < iVar1) {
          iVar1 = iVar3;
        }
        jx9_value_string(pCtx->pRet,zString,iVar1);
        pcVar4 = zString + iVar1;
        iVar3 = iVar1;
        if (pcVar4 < pcVar2) {
          jx9_value_string(pCtx->pRet,local_40,local_44);
        }
      }
      bVar5 = zString < pcVar2;
      zString = pcVar4;
    } while (bVar5);
  }
  return 0;
}

Assistant:

static int jx9Builtin_wordwrap(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zEnd, *zBreak;
	int iLen, iBreaklen, iChunk;
	if( nArg < 1 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the input string */
	zIn = jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Nothing to process, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Chunk length */
	iChunk = 75;
	iBreaklen = 0;
	zBreak = ""; /* cc warning */
	if( nArg > 1 ){
		iChunk = jx9_value_to_int(apArg[1]);
		if( iChunk < 1 ){
			iChunk = 75;
		}
		if( nArg > 2 ){
			zBreak = jx9_value_to_string(apArg[2], &iBreaklen);
		}
	}
	if( iBreaklen < 1 ){
		/* Set a default column break */
#ifdef __WINNT__
		zBreak = "\r\n";
		iBreaklen = (int)sizeof("\r\n")-1;
#else
		zBreak = "\n";
		iBreaklen = (int)sizeof(char);
#endif
	}
	/* Perform the requested operation */
	zEnd = &zIn[iLen];
	for(;;){
		int nMax;
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		nMax = (int)(zEnd-zIn);
		if( iChunk > nMax ){
			iChunk = nMax;
		}
		/* Append the column first */
		jx9_result_string(pCtx, zIn, iChunk); /* Will make it's own copy */
		/* Advance the cursor */
		zIn += iChunk;
		if( zIn < zEnd ){
			/* Append the line break */
			jx9_result_string(pCtx, zBreak, iBreaklen);
		}
	}
	return JX9_OK;
}